

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O0

bool __thiscall
S2Polygon::InitToOperation
          (S2Polygon *this,OpType op_type,SnapFunction *snap_function,S2Polygon *a,S2Polygon *b,
          S2Error *error)

{
  bool bVar1;
  S2Polygon *local_e8;
  unique_ptr<s2builderutil::S2PolygonLayer,_std::default_delete<s2builderutil::S2PolygonLayer>_>
  local_e0;
  unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_> local_d8;
  undefined1 local_d0 [8];
  S2BooleanOperation op;
  undefined1 local_60 [8];
  Options options;
  S2Error *error_local;
  S2Polygon *b_local;
  S2Polygon *a_local;
  SnapFunction *snap_function_local;
  OpType op_type_local;
  S2Polygon *this_local;
  
  options.source_id_lexicon_ =
       (ValueLexicon<S2BooleanOperation::SourceId,_std::hash<S2BooleanOperation::SourceId>,_std::equal_to<S2BooleanOperation::SourceId>_>
        *)error;
  S2BooleanOperation::Options::Options((Options *)local_60);
  S2BooleanOperation::Options::set_snap_function((Options *)local_60,snap_function);
  local_e8 = this;
  absl::make_unique<s2builderutil::S2PolygonLayer,S2Polygon*>((absl *)&local_e0,&local_e8);
  std::unique_ptr<S2Builder::Layer,std::default_delete<S2Builder::Layer>>::
  unique_ptr<s2builderutil::S2PolygonLayer,std::default_delete<s2builderutil::S2PolygonLayer>,void>
            ((unique_ptr<S2Builder::Layer,std::default_delete<S2Builder::Layer>> *)&local_d8,
             &local_e0);
  S2BooleanOperation::S2BooleanOperation
            ((S2BooleanOperation *)local_d0,op_type,&local_d8,(Options *)local_60);
  std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>::~unique_ptr(&local_d8);
  std::
  unique_ptr<s2builderutil::S2PolygonLayer,_std::default_delete<s2builderutil::S2PolygonLayer>_>::
  ~unique_ptr(&local_e0);
  bVar1 = S2BooleanOperation::Build
                    ((S2BooleanOperation *)local_d0,&(a->index_).super_S2ShapeIndex,
                     &(b->index_).super_S2ShapeIndex,(S2Error *)options.source_id_lexicon_);
  S2BooleanOperation::~S2BooleanOperation((S2BooleanOperation *)local_d0);
  S2BooleanOperation::Options::~Options((Options *)local_60);
  return bVar1;
}

Assistant:

bool S2Polygon::InitToOperation(S2BooleanOperation::OpType op_type,
                                const S2Builder::SnapFunction& snap_function,
                                const S2Polygon& a, const S2Polygon& b,
                                S2Error* error) {
  S2BooleanOperation::Options options;
  options.set_snap_function(snap_function);
  S2BooleanOperation op(op_type, make_unique<S2PolygonLayer>(this),
                         options);
  return op.Build(a.index_, b.index_, error);
}